

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCUnwrap(btok_cvc_t *cvc,octet *cert,size_t cert_len,octet *pubkey,size_t pubkey_len)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  octet *poVar8;
  octet *der;
  octet *der_00;
  octet *poVar9;
  der_anchor_t CertHAT [1];
  der_anchor_t CVCert [1];
  der_anchor_t DDT [1];
  der_anchor_t CVExt [1];
  der_anchor_t PubKey [1];
  der_anchor_t CertBody [1];
  octet *local_118;
  size_t local_108;
  ulong local_100;
  der_anchor_t local_f8;
  der_anchor_t local_d8;
  der_anchor_t local_b8;
  der_anchor_t local_98;
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  bVar2 = memIsValid(cvc,0x128);
  if (bVar2 == 0) {
    return 0x6d;
  }
  if (8 < (pubkey_len << 0x3c | pubkey_len >> 4)) {
    return 0x6d;
  }
  if ((0x159UL >> (pubkey_len >> 4 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  poVar8 = cvc->pubkey;
  if ((pubkey != (octet *)0x0 && pubkey_len == 0) && poVar8 != pubkey) {
    return 0x6d;
  }
  bVar2 = memIsValid(cert,cert_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = memIsValid(pubkey,pubkey_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = memIsDisjoint2(cvc,0x128,cert,cert_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = memIsDisjoint2(cvc,0x128,pubkey,pubkey_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  memSet(cvc,'\0',0x128);
  sVar4 = derTSEQDecStart(&local_d8,cert,cert_len,0x7f21);
  if (sVar4 == 0xffffffffffffffff) {
    return 0x132;
  }
  der = cert + sVar4;
  if (cert == (octet *)0x0) {
    der = (octet *)0x0;
  }
  sVar4 = cert_len - sVar4;
  memSet(cvc,'\0',0x128);
  sVar5 = derTSEQDecStart(&local_58,der,sVar4,0x7f4e);
  if (sVar5 != 0xffffffffffffffff) {
    sVar6 = derTSIZEDec2(der + sVar5,sVar4 - sVar5,0x5f29,0);
    if (sVar6 != 0xffffffffffffffff) {
      poVar9 = der + sVar5 + sVar6;
      sVar6 = (sVar4 - sVar5) - sVar6;
      sVar5 = derTPSTRDec((char *)0x0,&local_100,poVar9,sVar6,0x42);
      if (((sVar5 != 0xffffffffffffffff) && (0xfffffffffffffffa < local_100 - 0xd)) &&
         (sVar5 = derTPSTRDec(cvc->authority,(size_t *)0x0,poVar9,sVar6,0x42),
         sVar5 != 0xffffffffffffffff)) {
        poVar9 = poVar9 + sVar5;
        sVar7 = derTSEQDecStart(&local_78,poVar9,sVar6 - sVar5,0x7f49);
        if (sVar7 != 0xffffffffffffffff) {
          local_108 = (sVar6 - sVar5) - sVar7;
          sVar5 = derOIDDec2(poVar9 + sVar7,local_108,"1.2.112.0.2.0.34.101.45.2.1");
          if (sVar5 != 0xffffffffffffffff) {
            poVar9 = poVar9 + sVar7 + sVar5;
            local_108 = local_108 - sVar5;
            sVar5 = derTBITDec((octet *)0x0,&local_100,poVar9,local_108,3);
            if (sVar5 != 0xffffffffffffffff) {
              uVar1 = local_100 - 0x180 >> 7;
              if ((5 < (local_100 << 0x39 | uVar1)) || ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0)) {
                poVar9 = (octet *)0xffffffffffffffff;
                goto LAB_001374c6;
              }
              cvc->pubkey_len = local_100 >> 3;
              sVar5 = derTBITDec(poVar8,(size_t *)0x0,poVar9,local_108,3);
              if (sVar5 != 0xffffffffffffffff) {
                sVar6 = derTSEQDecStop(poVar9 + sVar5,&local_78);
                if (sVar6 != 0xffffffffffffffff) {
                  local_118 = poVar9 + sVar5 + sVar6;
                  local_108 = local_108 - (sVar5 + sVar6);
                  sVar5 = derTPSTRDec((char *)0x0,&local_100,local_118,local_108,0x5f20);
                  if (((sVar5 != 0xffffffffffffffff) && (0xfffffffffffffffa < local_100 - 0xd)) &&
                     (sVar5 = derTPSTRDec(cvc->holder,(size_t *)0x0,local_118,local_108,0x5f20),
                     sVar5 != 0xffffffffffffffff)) {
                    local_118 = local_118 + sVar5;
                    local_108 = local_108 - sVar5;
                    bVar2 = derStartsWith(local_118,local_108,0x7f4c);
                    if (bVar2 == 0) {
LAB_0013729a:
                      sVar5 = derTOCTDec2(cvc->from,local_118,local_108,0x5f25,6);
                      if (sVar5 != 0xffffffffffffffff) {
                        sVar6 = derTOCTDec2(cvc->until,local_118 + sVar5,local_108 - sVar5,0x5f24,6)
                        ;
                        if (sVar6 != 0xffffffffffffffff) {
                          local_118 = local_118 + sVar5 + sVar6;
                          sVar6 = (local_108 - sVar5) - sVar6;
                          bVar2 = derStartsWith(local_118,sVar6,0x65);
                          if (bVar2 == 0) {
LAB_0013747f:
                            sVar5 = derTSEQDecStop(local_118,&local_58);
                            poVar9 = (octet *)0xffffffffffffffff;
                            if (sVar5 != 0xffffffffffffffff) {
                              poVar9 = local_118 + (sVar5 - (long)der);
                            }
                            goto LAB_001374c6;
                          }
                          sVar5 = derTSEQDecStart(&local_98,local_118,sVar6,0x65);
                          if (sVar5 != 0xffffffffffffffff) {
                            local_118 = local_118 + sVar5;
                            sVar7 = derTSEQDecStart(&local_b8,local_118,sVar6 - sVar5,0x73);
                            if (sVar7 != 0xffffffffffffffff) {
                              sVar6 = (sVar6 - sVar5) - sVar7;
                              local_118 = local_118 + sVar7;
                              sVar5 = derOIDDec2(local_118,sVar6,"1.2.112.0.2.0.34.101.79.8.1");
                              if (sVar5 != 0xffffffffffffffff) {
                                sVar6 = sVar6 - sVar5;
                                local_118 = local_118 + sVar5;
                                sVar5 = derTSEQDecStart(&local_f8,local_118,sVar6,0x7f4c);
                                if (sVar5 != 0xffffffffffffffff) {
                                  sVar6 = sVar6 - sVar5;
                                  local_118 = local_118 + sVar5;
                                  sVar5 = derOIDDec2(local_118,sVar6,"1.2.112.0.2.0.34.101.79.6.2");
                                  if (sVar5 != 0xffffffffffffffff) {
                                    local_118 = local_118 + sVar5;
                                    sVar5 = derTOCTDec2(cvc->hat_esign,local_118,sVar6 - sVar5,4,2);
                                    if (sVar5 != 0xffffffffffffffff) {
                                      local_118 = local_118 + sVar5;
                                      sVar5 = derTSEQDecStop(local_118,&local_f8);
                                      if (sVar5 != 0xffffffffffffffff) {
                                        local_118 = local_118 + sVar5;
                                        sVar5 = derTSEQDecStop(local_118,&local_b8);
                                        if (sVar5 != 0xffffffffffffffff) {
                                          sVar6 = derTSEQDecStop(local_118 + sVar5,&local_98);
                                          if (sVar6 != 0xffffffffffffffff) {
                                            local_118 = local_118 + sVar5 + sVar6;
                                            goto LAB_0013747f;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      sVar5 = derTSEQDecStart(&local_f8,local_118,local_108,0x7f4c);
                      if (sVar5 != 0xffffffffffffffff) {
                        local_118 = local_118 + sVar5;
                        sVar6 = derOIDDec2(local_118,local_108 - sVar5,"1.2.112.0.2.0.34.101.79.6.1"
                                          );
                        if (sVar6 != 0xffffffffffffffff) {
                          local_108 = (local_108 - sVar5) - sVar6;
                          local_118 = local_118 + sVar6;
                          sVar5 = derTOCTDec2(cvc->hat_eid,local_118,local_108,4,5);
                          if (sVar5 != 0xffffffffffffffff) {
                            sVar6 = derTSEQDecStop(local_118 + sVar5,&local_f8);
                            if (sVar6 != 0xffffffffffffffff) {
                              local_118 = local_118 + sVar5 + sVar6;
                              local_108 = local_108 - (sVar5 + sVar6);
                              goto LAB_0013729a;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  poVar9 = (octet *)0xffffffffffffffff;
LAB_001374c6:
  if (poVar9 != (octet *)0xffffffffffffffff) {
    der_00 = der + (long)poVar9;
    if (der == (octet *)0x0) {
      der_00 = (octet *)0x0;
    }
    if (poVar8 == pubkey && pubkey_len == 0) {
      pubkey_len = cvc->pubkey_len;
    }
    sVar4 = sVar4 - (long)poVar9;
    if (pubkey_len == 0) {
      sVar6 = derDec3((octet **)0x0,der_00,sVar4,0x5f37,0x22);
      sVar5 = 0x22;
      if (sVar6 == 0xffffffffffffffff) {
        sVar6 = derDec3((octet **)0x0,der_00,sVar4,0x5f37,0x30);
        sVar5 = 0x30;
        if (sVar6 == 0xffffffffffffffff) {
          sVar6 = derDec3((octet **)0x0,der_00,sVar4,0x5f37,0x48);
          sVar5 = 0x48;
          if (sVar6 == 0xffffffffffffffff) {
            sVar6 = derDec3((octet **)0x0,der_00,sVar4,0x5f37,0x60);
            sVar5 = 0x60;
            if (sVar6 == 0xffffffffffffffff) {
              return 0x132;
            }
          }
        }
      }
    }
    else {
      sVar5 = 0x22;
      if (pubkey_len != 0x30) {
        sVar5 = pubkey_len - (pubkey_len >> 2);
      }
    }
    cvc->sig_len = sVar5;
    sVar5 = derTOCTDec2(cvc->sig,der_00,sVar4,0x5f37,sVar5);
    if (sVar5 != 0xffffffffffffffff) {
      poVar8 = der_00 + sVar5;
      if (der_00 == (octet *)0x0) {
        poVar8 = (octet *)0x0;
      }
      if ((pubkey_len != 0) &&
         (eVar3 = btokVerify(der,(size_t)poVar9,cvc->sig,pubkey,pubkey_len), eVar3 != 0)) {
        return eVar3;
      }
      sVar6 = derTSEQDecStop(poVar8,&local_d8);
      if (sVar6 != 0xffffffffffffffff) {
        if (sVar4 == sVar6 + sVar5) {
          eVar3 = btokCVCCheck(cvc);
          return eVar3;
        }
        return 0x132;
      }
    }
  }
  return 0x132;
}

Assistant:

err_t btokCVCUnwrap(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t t;
	const octet* body;
	size_t body_len;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		pubkey_len != 0 && pubkey_len != 48 &&
			pubkey_len != 64 && pubkey_len != 96 &&	pubkey_len != 128 ||
		pubkey_len == 0 && pubkey != 0 && pubkey != cvc->pubkey ||
		!memIsValid(cert, cert_len) ||
		!memIsValid(pubkey, pubkey_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), cert, cert_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// подготовить cvc
	memSetZero(cvc, sizeof(btok_cvc_t));
	// начать декодирование...
	t = derTSEQDecStart(CVCert, cert, cert_len, 0x7F21);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...декодировать основную часть...
	t = btokCVCBodyDec(cvc, cert, cert_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	body = cert, body_len = t;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...определить длину подписи...
	if (pubkey_len == 0 && pubkey == cvc->pubkey)
		pubkey_len = cvc->pubkey_len;
	if (pubkey_len == 0)
	{
		size_t sig_len;
		if (derDec3(0, cert, cert_len, 0x5F37, sig_len = 34) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 48) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 72) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 96) == SIZE_MAX)
			return ERR_BAD_FORMAT;
		cvc->sig_len = sig_len;
	}
	else
		cvc->sig_len = pubkey_len == 48 ? 34 : pubkey_len - pubkey_len / 4;
	// ...декодировать подпись...
	t = derTOCTDec2(cvc->sig, cert, cert_len, 0x5F37, cvc->sig_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...проверить подпись...
	if (pubkey_len)
	{
		code = btokVerify(body, body_len, cvc->sig, pubkey, pubkey_len);
		ERR_CALL_CHECK(code);
	}
	// ...завершить декодирование
	t = derTSEQDecStop(cert, CVCert);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	if (cert_len != 0)
		return ERR_BAD_FORMAT;
	// окончательная проверка cvc
	return btokCVCCheck(cvc);
}